

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

int ztlex_next_token(ztlex_t *lex,ztlextok_t *token,ztlexinf_t **info)

{
  int iVar1;
  uint uVar2;
  ushort **ppuVar3;
  long *in_RDX;
  ztlextok_t *in_RSI;
  ztlex *in_RDI;
  int len;
  int i;
  int c;
  int local_28;
  
  *in_RDX = 0;
  while( true ) {
    do {
      iVar1 = (*in_RDI->getC)(in_RDI);
      if (iVar1 == -1) {
        return 0;
      }
      ppuVar3 = __ctype_b_loc();
    } while (((*ppuVar3)[iVar1] & 0x2000) != 0);
    (*in_RDI->ungetC)(iVar1,in_RDI);
    iVar1 = (*in_RDI->getC)(in_RDI);
    if (iVar1 == -1) {
      return 0;
    }
    if (iVar1 != 0x2f) break;
    iVar1 = (*in_RDI->getC)(in_RDI);
    if (iVar1 != 0x2f) {
      if (iVar1 != -1) {
        (*in_RDI->ungetC)(iVar1,in_RDI);
      }
      (*in_RDI->ungetC)(0x2f,in_RDI);
      goto LAB_001049a7;
    }
    do {
      iVar1 = (*in_RDI->getC)(in_RDI);
    } while (iVar1 != 10);
    (*in_RDI->ungetC)(10,in_RDI);
  }
  (*in_RDI->ungetC)(iVar1,in_RDI);
LAB_001049a7:
  local_28 = 0;
  while( true ) {
    if (5 < local_28) {
      uVar2 = (*in_RDI->getC)(in_RDI);
      switch(uVar2) {
      case 0x28:
        *in_RSI = 9;
        break;
      case 0x29:
        *in_RSI = 10;
        break;
      case 0x2a:
        *in_RSI = 3;
        break;
      case 0x2b:
        *in_RSI = 1;
        break;
      case 0x2c:
        *in_RSI = 0x13;
        break;
      case 0x2d:
        *in_RSI = 2;
        break;
      default:
        if (uVar2 != 0xffffffff) {
          (*in_RDI->ungetC)(uVar2,in_RDI);
          fprintf(_stderr,"Unknown token \'%c\' at line %d column %d\n",(ulong)uVar2,
                  (ulong)(uint)in_RDI->line,(ulong)(uint)in_RDI->column);
        }
        return 0;
      case 0x2f:
        *in_RSI = 4;
        break;
      case 0x3b:
        *in_RSI = 6;
        break;
      case 0x3d:
        *in_RSI = 5;
        break;
      case 0x5b:
        *in_RSI = 0x11;
        break;
      case 0x5d:
        *in_RSI = 0x12;
        break;
      case 0x7b:
        *in_RSI = 0xf;
        break;
      case 0x7d:
        *in_RSI = 0x10;
      }
      (in_RDI->info).line = in_RDI->line;
      (in_RDI->info).column = in_RDI->column + -1;
      (in_RDI->info).length = 0;
      *in_RDX = (long)&in_RDI->info;
      return 1;
    }
    iVar1 = (*ztlex_next_token::map[local_28].fn)(in_RDI);
    if (iVar1 == -1) break;
    if (iVar1 != 0) {
      *in_RSI = ztlex_next_token::map[local_28].token;
      (in_RDI->info).line = in_RDI->line;
      (in_RDI->info).column = in_RDI->column - iVar1;
      (in_RDI->info).length = iVar1;
      memcpy((in_RDI->info).lexeme,in_RDI->lexeme,(long)(iVar1 + 1));
      *in_RDX = (long)&in_RDI->info;
      return 1;
    }
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

int ztlex_next_token(ztlex_t     *lex,
                     ztlextok_t  *token,
               const ztlexinf_t **info)
{
  static const struct
  {
    int        (*fn)(ztlex_t *);
    ztlextok_t token;
  }
  map[] =
  {
    { ztlex_isdollarhex, ZTTOKEN_DOLLARHEX },
    { ztlex_ishex,       ZTTOKEN_HEX       },
    { ztlex_isdecimal,   ZTTOKEN_DECIMAL   },
    { ztlex_isinteger,   ZTTOKEN_INT       },
    { ztlex_isnil,       ZTTOKEN_NIL       },
    { ztlex_isname,      ZTTOKEN_NAME      },
  };

  int c;
  int i;

  assert(lex);
  assert(token);
  assert(info);

  *info = NULL;

again:
  /* absorb all leading whitespace */
  do
  {
    c = lex->getC(lex);
    if (c == EOF)
      return 0;
  }
  while (isspace(c));

  lex->ungetC(c, lex);

  /* absorb comments */
  {
    c = lex->getC(lex);
    if (c == EOF)
      return 0;

    if (c != '/')
    {
      lex->ungetC(c, lex);
      goto notcomment;
    }

    c = lex->getC(lex);
    if (c != '/') /* including EOF */
    {
      if (c != EOF)
        lex->ungetC(c, lex);
      lex->ungetC('/', lex);
      goto notcomment;
    }

    /* we've found '//' - absorb the remainder of the line */
    do
      c = lex->getC(lex);
    while (c != '\n');

    if (c != EOF)
      lex->ungetC(c, lex);

    goto again;
  }

notcomment:
  /* try the complex tokens first */
  for (i = 0; i < (int) NELEMS(map); i++)
  {
    int len;

    len = map[i].fn(lex);
    if (len == EOF)
    {
      return 0;
    }
    else if (len)
    {
      *token = map[i].token;

      lex->info.line   = lex->line;
      lex->info.column = lex->column - len; /* report start of token */
      lex->info.length = len;
      memcpy(&lex->info.lexeme[0], lex->lexeme, len + 1);
      *info = &lex->info;
      return 1;
    }
  }

  /* deal with basic tokens */
  c = lex->getC(lex);
  switch (c)
  {
    case '(': *token = ZTTOKEN_LPAREN;    break;
    case ')': *token = ZTTOKEN_RPAREN;    break;
    case '*': *token = ZTTOKEN_TIMES;     break;
    case '+': *token = ZTTOKEN_PLUS;      break;
    case ',': *token = ZTTOKEN_COMMA;     break;
    case '-': *token = ZTTOKEN_MINUS;     break;
    case '/': *token = ZTTOKEN_DIVIDE;    break;
    case ';': *token = ZTTOKEN_SEMICOLON; break;
    case '=': *token = ZTTOKEN_EQUALS;    break;
    case '[': *token = ZTTOKEN_LSQBRA;    break;
    case ']': *token = ZTTOKEN_RSQBRA;    break;
    case '{': *token = ZTTOKEN_LBRACE;    break;
    case '}': *token = ZTTOKEN_RBRACE;    break;
    default:
      if (c != EOF) {
        lex->ungetC(c, lex);
        fprintf(stderr, "Unknown token '%c' at line %d column %d\n", c, lex->line, lex->column);
      }
      return 0;
  }

  lex->info.line   = lex->line;
  lex->info.column = lex->column - 1; /* report start of token */
  lex->info.length = 0; /* FIXME: Should basic tokens have any length? */
  *info = &lex->info;
  return 1;
}